

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlChar * xmlGetPropNodeValueInternal(xmlAttr *prop)

{
  xmlNode *list;
  xmlChar *pxVar1;
  
  if (prop->type == XML_ATTRIBUTE_DECL) {
    pxVar1 = xmlStrdup((xmlChar *)prop->psvi);
    return pxVar1;
  }
  if (prop->type == XML_ATTRIBUTE_NODE) {
    list = prop->children;
    if (list != (xmlNode *)0x0) {
      if ((list->next == (_xmlNode *)0x0) && (list->type - XML_TEXT_NODE < 2)) {
        pxVar1 = xmlStrdup(list->content);
        return pxVar1;
      }
      pxVar1 = xmlNodeListGetString(prop->doc,list,1);
      if (pxVar1 != (xmlChar *)0x0) {
        return pxVar1;
      }
    }
    pxVar1 = xmlStrdup("");
    return pxVar1;
  }
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar*
xmlGetPropNodeValueInternal(const xmlAttr *prop)
{
    if (prop == NULL)
	return(NULL);
    if (prop->type == XML_ATTRIBUTE_NODE) {
	/*
	* Note that we return at least the empty string.
	*   TODO: Do we really always want that?
	*/
	if (prop->children != NULL) {
	    if ((prop->children->next == NULL) &&
		((prop->children->type == XML_TEXT_NODE) ||
		(prop->children->type == XML_CDATA_SECTION_NODE)))
	    {
		/*
		* Optimization for the common case: only 1 text node.
		*/
		return(xmlStrdup(prop->children->content));
	    } else {
		xmlChar *ret;

		ret = xmlNodeListGetString(prop->doc, prop->children, 1);
		if (ret != NULL)
		    return(ret);
	    }
	}
	return(xmlStrdup((xmlChar *)""));
    } else if (prop->type == XML_ATTRIBUTE_DECL) {
	return(xmlStrdup(((xmlAttributePtr)prop)->defaultValue));
    }
    return(NULL);
}